

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

iterator __thiscall CP::vector<int>::insert(vector<int> *this,iterator it,int *element)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  
  piVar3 = this->mData;
  lVar5 = (long)it - (long)piVar3;
  uVar2 = this->mSize;
  uVar1 = uVar2 + 1;
  uVar4 = uVar2;
  if (this->mCap < uVar1) {
    uVar2 = this->mCap * 2;
    if (uVar2 <= uVar1) {
      uVar2 = uVar1;
    }
    expand(this,uVar2);
    piVar3 = this->mData;
    uVar2 = this->mSize;
    uVar4 = uVar2;
  }
  for (; (ulong)(lVar5 >> 2) < uVar2; uVar2 = uVar2 - 1) {
    piVar3[uVar2] = piVar3[uVar2 - 1];
  }
  *(int *)((long)piVar3 + lVar5) = *element;
  this->mSize = uVar4 + 1;
  return (iterator)((long)piVar3 + lVar5);
}

Assistant:

iterator insert(iterator it,const T& element) {
      size_t pos = it - begin();
      ensureCapacity(mSize + 1);
      for(size_t i = mSize;i > pos;i--) {
        mData[i] = mData[i-1];
      }
      mData[pos] = element;
      mSize++;
      return begin()+pos;
    }